

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O0

int __thiscall
Ptex::v2_2::PtexReader::DefaultInputHandler::close(DefaultInputHandler *this,int __fd)

{
  int iVar1;
  undefined4 in_register_00000034;
  bool ok;
  bool local_12;
  
  local_12 = false;
  if ((FILE *)CONCAT44(in_register_00000034,__fd) != (FILE *)0x0) {
    iVar1 = fclose((FILE *)CONCAT44(in_register_00000034,__fd));
    local_12 = iVar1 == 0;
  }
  if (this->buffer != (char *)0x0) {
    if (this->buffer != (char *)0x0) {
      operator_delete__(this->buffer);
    }
    this->buffer = (char *)0x0;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),local_12);
}

Assistant:

virtual bool close(Handle handle) {
            bool ok = handle && (fclose((FILE*)handle) == 0);
            if (buffer) { delete [] buffer; buffer = 0; }
            return ok;
        }